

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_update_fg_30
               (secp256k1_modinv32_signed30 *f,secp256k1_modinv32_signed30 *g,
               secp256k1_modinv32_trans2x2 *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int i;
  int64_t cg;
  int64_t cf;
  int32_t gi;
  int32_t fi;
  int32_t r;
  int32_t q;
  int32_t v;
  int32_t u;
  int32_t M30;
  secp256k1_modinv32_trans2x2 *t_local;
  secp256k1_modinv32_signed30 *g_local;
  secp256k1_modinv32_signed30 *f_local;
  
  iVar1 = t->u;
  iVar2 = t->v;
  iVar3 = t->q;
  iVar4 = t->r;
  lVar5 = (long)iVar1 * (long)f->v[0] + (long)iVar2 * (long)g->v[0];
  lVar6 = (long)iVar3 * (long)f->v[0] + (long)iVar4 * (long)g->v[0];
  for (i = 1; cf = lVar5 >> 0x1e, cg = lVar6 >> 0x1e, i < 9; i = i + 1) {
    lVar5 = (long)iVar1 * (long)f->v[i] + (long)iVar2 * (long)g->v[i] + cf;
    lVar6 = (long)iVar3 * (long)f->v[i] + (long)iVar4 * (long)g->v[i] + cg;
    f->v[i + -1] = (uint)lVar5 & 0x3fffffff;
    g->v[i + -1] = (uint)lVar6 & 0x3fffffff;
  }
  f->v[8] = (int32_t)cf;
  g->v[8] = (int32_t)cg;
  return;
}

Assistant:

static void secp256k1_modinv32_update_fg_30(secp256k1_modinv32_signed30 *f, secp256k1_modinv32_signed30 *g, const secp256k1_modinv32_trans2x2 *t) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t fi, gi;
    int64_t cf, cg;
    int i;
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    cf = (int64_t)u * fi + (int64_t)v * gi;
    cg = (int64_t)q * fi + (int64_t)r * gi;
    /* Verify that the bottom 30 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cf & M30) == 0); cf >>= 30;
    VERIFY_CHECK(((int32_t)cg & M30) == 0); cg >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[f,g], and store them in output limb i-1 (shifting
     * down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        cf += (int64_t)u * fi + (int64_t)v * gi;
        cg += (int64_t)q * fi + (int64_t)r * gi;
        f->v[i - 1] = (int32_t)cf & M30; cf >>= 30;
        g->v[i - 1] = (int32_t)cg & M30; cg >>= 30;
    }
    /* What remains is limb 9 of t*[f,g]; store it as output limb 8. */
    f->v[8] = (int32_t)cf;
    g->v[8] = (int32_t)cg;
}